

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O2

iterator * __thiscall bitdeque<32768>::end(iterator *__return_storage_ptr__,bitdeque<32768> *this)

{
  long lVar1;
  Iterator<false> x;
  _Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_> *p_Var2;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = &(this->m_deque).
            super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>;
  x.m_bitpos = 0;
  x.m_it._M_cur = (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_cur;
  x.m_it._M_first = (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_first;
  x.m_it._M_last = (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_last;
  x.m_it._M_node = (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_node;
  x._36_4_ = in_stack_ffffffffffffffec;
  ::operator-(__return_storage_ptr__,x,(difference_type)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() noexcept { return iterator{m_deque.end(), 0} - m_pad_end; }